

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvaluationFunction.cpp
# Opt level: O2

void __thiscall
imrt::EvaluationFunction::generate_linear_system
          (EvaluationFunction *this,Plan *p,vector<double,_std::allocator<double>_> *w,
          vector<double,_std::allocator<double>_> *Zmin,
          vector<double,_std::allocator<double>_> *Zmax)

{
  Station *this_00;
  ostream *poVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  Matrix *pMVar4;
  _List_node_base *p_Var5;
  bool bVar6;
  int o;
  long lVar7;
  int k;
  int iVar8;
  long lVar9;
  int a;
  double dVar10;
  _List_node_base local_48;
  
  bVar6 = false;
  for (lVar7 = 0; lVar7 < this->nb_organs; lVar7 = lVar7 + 1) {
    for (iVar8 = 0;
        iVar8 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7]; iVar8 = iVar8 + 1) {
      if (bVar6) {
        std::operator<<((ostream *)&std::cout," + ");
      }
      if (iVar8 == 0) {
        std::operator<<((ostream *)&std::cout,"(");
      }
      dVar10 = (Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[lVar7];
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
        std::operator<<((ostream *)&std::cout,"max(");
        poVar1 = std::ostream::_M_insert<double>
                           ((Zmin->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar7]);
        poVar1 = std::operator<<(poVar1,"- Z_");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)lVar7);
        poVar1 = std::operator<<(poVar1,"_");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar8);
      }
      else {
        poVar1 = std::operator<<((ostream *)&std::cout,"max(Z_");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)lVar7);
        poVar1 = std::operator<<(poVar1,"_");
        poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,iVar8);
        std::operator<<(poVar1,"-");
        poVar1 = std::ostream::_M_insert<double>
                           ((Zmax->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar7]);
      }
      std::operator<<(poVar1,", 0)^2");
      if (iVar8 == (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7] + -1) {
        std::operator<<((ostream *)&std::cout,")");
      }
      bVar6 = true;
    }
    poVar1 = std::operator<<((ostream *)&std::cout,"/");
    std::ostream::operator<<
              ((ostream *)poVar1,
               (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7]);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  for (lVar7 = 0; lVar7 < this->nb_organs; lVar7 = lVar7 + 1) {
    for (lVar9 = 0;
        lVar9 < (this->nb_voxels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7]; lVar9 = lVar9 + 1) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Z_");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)lVar7);
      poVar1 = std::operator<<(poVar1,"_");
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)lVar9);
      std::operator<<(poVar1,"=");
      p_Var2 = (_List_node_base *)Plan::get_stations_abi_cxx11_(p);
      iVar8 = 0;
      bVar6 = false;
      p_Var3 = p_Var2;
      while (p_Var3 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
                       &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
            p_Var3 != p_Var2) {
        this_00 = (Station *)p_Var3[1]._M_next;
        pMVar4 = Station::getDepositionMatrix(this_00,(int)lVar7);
        for (a = 0; a < this_00->max_apertures; a = a + 1) {
          Station::open_beamlets_abi_cxx11_((list<int,_std::allocator<int>_> *)&local_48,this_00,a);
          dVar10 = 0.0;
          p_Var5 = &local_48;
          while (p_Var5 = (((_List_impl *)&p_Var5->_M_next)->_M_node).super__List_node_base._M_next,
                p_Var5 != &local_48) {
            dVar10 = dVar10 + pMVar4->p[lVar9][*(int *)&p_Var5[1]._M_next];
          }
          std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
                    ((_List_base<int,_std::allocator<int>_> *)&local_48);
          if (0.0 < dVar10) {
            if (bVar6) {
              std::operator<<((ostream *)&std::cout," + ");
            }
            poVar1 = std::ostream::_M_insert<double>(dVar10);
            poVar1 = std::operator<<(poVar1," * I_");
            std::ostream::operator<<((ostream *)poVar1,iVar8);
            bVar6 = true;
          }
          iVar8 = iVar8 + 1;
        }
      }
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  return;
}

Assistant:

void EvaluationFunction::generate_linear_system(const Plan& p, vector<double>& w, vector<double>& Zmin, vector<double>& Zmax){
	bool flag=false;
	for(int o=0; o<nb_organs; o++){
		double pen=0.0;
		for(int k=0; k<nb_voxels[o]; k++){
			if(flag) cout << " + ";
			flag = true;
			if(k==0) cout << "(";
			if(Zmin[o] == 0 )
				cout << "max(Z_" << o << "_" << k << "-" << Zmax[o] << ", 0)^2" ;
			else
				cout << "max(" << Zmin[o] << "- Z_" << o << "_" << k << ", 0)^2" ;
			if(k==nb_voxels[o]-1) cout << ")";
		}
		cout << "/" << nb_voxels[o];
	}
	cout << endl;

	for(int o=0; o<nb_organs; o++){
		for(int k=0; k<nb_voxels[o]; k++){
			cout << "Z_" << o << "_" << k << "=" ;
			int ap=0; //aperture variable id
			bool flag = false;
			for(auto s : p.get_stations()){
				const Matrix&  D = s->getDepositionMatrix(o);
				for(int a=0; a<s->getNbApertures(); a++){
					double ap_dose_per_intensity=0.0;
					for(auto b: s->open_beamlets(a)) ap_dose_per_intensity+=D(k,b);

					if (ap_dose_per_intensity>0.0){
						if(flag) cout << " + ";
						cout << ap_dose_per_intensity << " * I_" << ap;
						flag = true;

					}
					ap++;
				}
			}
			cout << endl;
		}
	}
}